

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.h
# Opt level: O2

bool __thiscall
google::protobuf::io::CodedInputStream::ReadVarint32(CodedInputStream *this,uint32 *value)

{
  long lVar1;
  uint8 *puVar2;
  byte *pbVar3;
  bool bVar4;
  byte *pbVar5;
  uint uVar6;
  long lVar7;
  uint32 auStack_10 [2];
  
  puVar2 = this->buffer_;
  if ((puVar2 < this->buffer_end_) && (-1 < (char)*puVar2)) {
    *value = (int)(char)*puVar2;
    this->buffer_ = puVar2 + 1;
    return true;
  }
  pbVar3 = this->buffer_;
  pbVar5 = this->buffer_end_;
  if (((int)pbVar5 - (int)pbVar3 < 10) && ((pbVar5 <= pbVar3 || ((char)pbVar5[-1] < '\0')))) {
    bVar4 = ReadVarint64Fallback(this,(uint64 *)auStack_10);
    if (bVar4) {
      *value = auStack_10[0];
    }
    return bVar4;
  }
  uVar6 = *pbVar3 & 0x7f;
  if ((char)*pbVar3 < '\0') {
    uVar6 = uVar6 | (pbVar3[1] & 0x7f) << 7;
    if ((char)pbVar3[1] < '\0') {
      uVar6 = uVar6 | (pbVar3[2] & 0x7f) << 0xe;
      if ((char)pbVar3[2] < '\0') {
        uVar6 = uVar6 | (pbVar3[3] & 0x7f) << 0x15;
        if ((char)pbVar3[3] < '\0') {
          pbVar5 = pbVar3 + 5;
          uVar6 = uVar6 | (uint)pbVar3[4] << 0x1c;
          if ((char)pbVar3[4] < '\0') {
            lVar7 = 0;
            do {
              if ((int)lVar7 == 5) {
                return false;
              }
              lVar1 = lVar7 + 1;
              pbVar3 = pbVar5 + lVar7;
              lVar7 = lVar1;
            } while ((char)*pbVar3 < '\0');
            pbVar5 = pbVar5 + lVar1;
          }
        }
        else {
          pbVar5 = pbVar3 + 4;
        }
      }
      else {
        pbVar5 = pbVar3 + 3;
      }
    }
    else {
      pbVar5 = pbVar3 + 2;
    }
  }
  else {
    pbVar5 = pbVar3 + 1;
  }
  *value = uVar6;
  this->buffer_ = pbVar5;
  return true;
}

Assistant:

inline bool CodedInputStream::ReadVarint32(uint32* value) {
  if (GOOGLE_PREDICT_TRUE(buffer_ < buffer_end_) && *buffer_ < 0x80) {
    *value = *buffer_;
    Advance(1);
    return true;
  } else {
    return ReadVarint32Fallback(value);
  }
}